

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  ArrayPtr<capnp::word> AVar1;
  word scratch [16];
  MallocMessageBuilder builder;
  word *local_198;
  uint local_18c;
  word local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  MallocMessageBuilder local_108;
  
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188.content = 0;
  uStack_180 = 0;
  AVar1.size_ = 0x10;
  AVar1.ptr = &local_188;
  MallocMessageBuilder::MallocMessageBuilder(&local_108,AVar1,FIXED_SIZE);
  AVar1 = MallocMessageBuilder::allocateSegment(&local_108,1);
  if ((&local_188 != AVar1.ptr) && (kj::_::Debug::minSeverity < 3)) {
    local_198 = AVar1.ptr;
    kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x27,ERROR,
               "\"failed: expected \" \"(scratch) == (segment.begin())\", scratch, segment.begin()",
               (char (*) [48])"failed: expected (scratch) == (segment.begin())",
               (word (*) [16])&local_188,&local_198);
  }
  if (((word *)AVar1.size_ != (word *)&DAT_00000010) && (kj::_::Debug::minSeverity < 3)) {
    local_18c = 0x10;
    local_198 = (word *)AVar1.size_;
    kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x28,ERROR,
               "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
               (char (*) [43])"failed: expected (16u) == (segment.size())",&local_18c,
               (unsigned_long *)&local_198);
  }
  AVar1 = MallocMessageBuilder::allocateSegment(&local_108,1);
  if ((&local_188 == AVar1.ptr) && (kj::_::Debug::minSeverity < 3)) {
    local_198 = AVar1.ptr;
    kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x2b,ERROR,
               "\"failed: expected \" \"(scratch) != (segment.begin())\", scratch, segment.begin()",
               (char (*) [48])"failed: expected (scratch) != (segment.begin())",
               (word (*) [16])&local_188,&local_198);
  }
  if (((word *)AVar1.size_ != (word *)&DAT_00000010) && (kj::_::Debug::minSeverity < 3)) {
    local_18c = 0x10;
    local_198 = (word *)AVar1.size_;
    kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
               (char (*) [43])"failed: expected (16u) == (segment.size())",&local_18c,
               (unsigned_long *)&local_198);
  }
  AVar1 = MallocMessageBuilder::allocateSegment(&local_108,1);
  if ((&local_188 == AVar1.ptr) && (kj::_::Debug::minSeverity < 3)) {
    local_198 = AVar1.ptr;
    kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"(scratch) != (segment.begin())\", scratch, segment.begin()",
               (char (*) [48])"failed: expected (scratch) != (segment.begin())",
               (word (*) [16])&local_188,&local_198);
  }
  if (((word *)AVar1.size_ != (word *)&DAT_00000010) && (kj::_::Debug::minSeverity < 3)) {
    local_18c = 0x10;
    local_198 = (word *)AVar1.size_;
    kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
               (char (*) [43])"failed: expected (16u) == (segment.size())",&local_18c,
               (unsigned_long *)&local_198);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Endian, Byte) {
  byte bytes[] = {123, 45, 67, 89};

  WireValue<uint8_t>* vals = reinterpret_cast<WireValue<uint8_t>*>(bytes);

  EXPECT_EQ(123, vals[0].get());
  EXPECT_EQ(45, vals[1].get());
  EXPECT_EQ(67, vals[2].get());
  EXPECT_EQ(89, vals[3].get());

  vals[0].set(21);
  vals[1].set(43);
  vals[2].set(65);
  vals[3].set(87);

  EXPECT_EQ(21, bytes[0]);
  EXPECT_EQ(43, bytes[1]);
  EXPECT_EQ(65, bytes[2]);
  EXPECT_EQ(87, bytes[3]);
}